

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall webpp::Logger::info(Logger *this,string *msg)

{
  ostream *poVar1;
  string *msg_local;
  Logger *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[INFO]: ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void info(const std::string msg) {
    std::cout << "[INFO]: " << msg << std::endl;
  }